

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void glist_redrawall(_glist *gl,int action)

{
  _glist *gl_00;
  t_pd p_Var1;
  int iVar2;
  int iVar3;
  t_gobj **pptVar4;
  
  iVar2 = glist_isvisible(gl);
  pptVar4 = &gl->gl_list;
  do {
    gl_00 = (_glist *)*pptVar4;
    if (gl_00 == (_glist *)0x0) {
      return;
    }
    p_Var1 = (gl_00->gl_obj).te_g.g_pd;
    if ((iVar2 == 0) || (p_Var1 != scalar_class)) {
      if (p_Var1 == canvas_class) {
        glist_redrawall(gl_00,action);
      }
    }
    else if (action == 2) {
      iVar3 = glist_isvisible(gl);
      if (iVar3 != 0) {
        iVar3 = 0;
LAB_00135b1e:
        gobj_vis((t_gobj *)gl_00,gl,iVar3);
      }
    }
    else if (action == 1) {
      iVar3 = glist_isvisible(gl);
      if (iVar3 != 0) {
        iVar3 = 1;
        goto LAB_00135b1e;
      }
    }
    else {
      scalar_redraw((t_scalar *)gl_00,gl);
    }
    pptVar4 = &(gl_00->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void glist_redrawall(t_glist *gl, int action)
{
    t_gobj *g;
    int vis = glist_isvisible(gl);
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (vis && g->g_pd == scalar_class)
        {
            if (action == 1)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 1);
            }
            else if (action == 2)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 0);
            }
            else scalar_redraw((t_scalar *)g, gl);
        }
        else if (g->g_pd == canvas_class)
            glist_redrawall((t_glist *)g, action);
    }
}